

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  cmPropertyMap *this_00;
  char *pcVar4;
  reference str1;
  ostream *poVar5;
  string *psVar6;
  mapped_type *this_01;
  string local_460 [32];
  undefined1 local_440 [8];
  ostringstream e_1;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  string evaluatedValue;
  char *propertyValue;
  undefined1 local_258 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prop;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  iterator __end2;
  iterator __begin2;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *exportProperties;
  cmPropertyMap *targetProperties;
  string *errorMessage_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *gte_local;
  cmExportFileGenerator *this_local;
  
  targetProperties = (cmPropertyMap *)errorMessage;
  errorMessage_local = (string *)properties;
  properties_local = (ImportPropertyMap *)gte;
  gte_local = (cmGeneratorTarget *)this;
  this_00 = cmTarget::GetProperties(gte->Target);
  exportProperties = (char *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"EXPORT_PROPERTIES",&local_61);
  pcVar4 = cmPropertyMap::GetPropertyValue(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (pcVar4 != (char *)0x0) {
    local_40 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar4,(allocator<char> *)((long)&__begin2._M_current + 7));
    cmSystemTools::ExpandedListArgument(&local_98,&local_b8,false);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__begin2._M_current + 7));
    local_80 = &local_98;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_80);
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_80);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_d0), bVar2) {
      str1 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
      bVar2 = cmsys::SystemTools::StringStartsWith(str1,"IMPORTED_");
      if ((bVar2) || (bVar2 = cmsys::SystemTools::StringStartsWith(str1,"INTERFACE_"), bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
        poVar5 = std::operator<<((ostream *)local_258,"Target \"");
        psVar6 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)&(properties_local->_M_t)._M_impl);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"\" contains property \"");
        poVar5 = std::operator<<(poVar5,(string *)str1);
        poVar5 = std::operator<<(poVar5,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ");
        std::operator<<(poVar5,"properties are reserved.");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)targetProperties,(string *)&propertyValue);
        std::__cxx11::string::~string((string *)&propertyValue);
        this_local._7_1_ = 0;
        cVar3 = '\x01';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
        goto LAB_0041e7ab;
      }
      pcVar4 = cmPropertyMap::GetPropertyValue((cmPropertyMap *)exportProperties,str1);
      evaluatedValue.field_2._8_8_ = pcVar4;
      if (pcVar4 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,pcVar4,&local_2c1);
        cmGeneratorExpression::Preprocess
                  ((string *)local_2a0,&local_2c0,StripAllGeneratorExpressions,false);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
        cVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2a0,(char *)evaluatedValue.field_2._8_8_);
        uVar1 = evaluatedValue.field_2._8_8_;
        if ((bool)cVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
          poVar5 = std::operator<<((ostream *)local_440,"Target \"");
          psVar6 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)&(properties_local->_M_t)._M_impl);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          poVar5 = std::operator<<(poVar5,"\" contains property \"");
          poVar5 = std::operator<<(poVar5,(string *)str1);
          poVar5 = std::operator<<(poVar5,"\" in EXPORT_PROPERTIES but this property contains a ");
          std::operator<<(poVar5,"generator expression. This is not allowed.");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)targetProperties,local_460);
          std::__cxx11::string::~string(local_460);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
        }
        else {
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)errorMessage_local,str1);
          std::__cxx11::string::operator=((string *)this_01,(char *)uVar1);
        }
        std::__cxx11::string::~string((string *)local_2a0);
        if ((bool)cVar3) goto LAB_0041e7ab;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cVar3 = '\x02';
LAB_0041e7ab:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    if (cVar3 == '\x01') goto LAB_0041e7da;
  }
  this_local._7_1_ = 1;
LAB_0041e7da:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  auto& targetProperties = gte->Target->GetProperties();
  if (const char* exportProperties =
        targetProperties.GetPropertyValue("EXPORT_PROPERTIES")) {
    for (auto& prop : cmSystemTools::ExpandedListArgument(exportProperties)) {
      /* Black list reserved properties */
      if (cmSystemTools::StringStartsWith(prop, "IMPORTED_") ||
          cmSystemTools::StringStartsWith(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      auto propertyValue = targetProperties.GetPropertyValue(prop);
      if (propertyValue == nullptr) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = propertyValue;
    }
  }
  return true;
}